

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O2

void __thiscall Assimp::D3DS::Mesh::Mesh(Mesh *this,string *name)

{
  (this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mNormals.
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mNormals.
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
  super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
  super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mPositions.
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces.
  super__Vector_base<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mPositions.
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mPositions.
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mNormals.
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->mName,(string *)name);
  (this->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mTexCoords).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mTexCoords).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mTexCoords).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mMat).a1 = 1.0;
  (this->mMat).a2 = 0.0;
  (this->mMat).a3 = 0.0;
  (this->mMat).a4 = 0.0;
  (this->mMat).b1 = 0.0;
  (this->mMat).b2 = 1.0;
  (this->mMat).b3 = 0.0;
  (this->mMat).b4 = 0.0;
  (this->mMat).c1 = 0.0;
  (this->mMat).c2 = 0.0;
  (this->mMat).c3 = 1.0;
  (this->mMat).c4 = 0.0;
  (this->mMat).d1 = 0.0;
  (this->mMat).d2 = 0.0;
  (this->mMat).d3 = 0.0;
  (this->mMat).d4 = 1.0;
  return;
}

Assistant:

explicit Mesh(const std::string &name)
    : mName(name)
    {
    }